

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  string *psVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  ostream *poVar6;
  allocator<char> local_12b1;
  key_type local_12b0;
  string local_1290 [32];
  undefined1 local_1270 [8];
  ModuleWriter writer;
  key_type local_1200;
  allocator<char> local_11d9;
  string local_11d8;
  allocator<char> local_11b1;
  string local_11b0;
  allocator<char> local_1189;
  string local_1188;
  allocator<char> local_1161;
  string local_1160;
  allocator<char> local_1139;
  string local_1138;
  allocator<char> local_1111;
  string local_1110;
  PassRunner local_10f0 [8];
  PassRunner passRunner;
  Fatal local_fd8;
  undefined1 local_e49 [400];
  undefined1 local_cb9 [401];
  ParseException *p;
  string local_b20 [39];
  allocator<char> local_af9;
  key_type local_af8;
  string local_ad8 [36];
  undefined1 local_ab4 [8];
  ModuleReader reader;
  Module wasm;
  key_type local_758;
  string local_738 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_710;
  allocator<char> local_6e9;
  string local_6e8 [39];
  anon_class_1_0_00000001 local_6c1;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_6c0;
  allocator<char> local_699;
  string local_698 [39];
  allocator<char> local_671;
  string local_670 [39];
  allocator<char> local_649;
  string local_648 [39];
  anon_class_1_0_00000001 local_621;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_620;
  allocator<char> local_5f9;
  string local_5f8 [39];
  allocator<char> local_5d1;
  string local_5d0 [39];
  allocator<char> local_5a9;
  string local_5a8 [32];
  anon_class_8_1_b34c22e1 local_588;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_580;
  allocator<char> local_559;
  string local_558 [39];
  allocator<char> local_531;
  string local_530 [39];
  allocator<char> local_509;
  string local_508 [32];
  anon_class_8_1_a7c36fff local_4e8;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_4e0;
  allocator<char> local_4b9;
  string local_4b8 [39];
  allocator<char> local_491;
  string local_490 [39];
  allocator<char> local_469;
  string local_468 [32];
  anon_class_8_1_09c29441 local_448;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_440;
  allocator<char> local_419;
  string local_418 [39];
  allocator<char> local_3f1;
  string local_3f0 [39];
  allocator<char> local_3c9;
  string local_3c8 [32];
  anon_class_8_1_29de6772 local_3a8;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_3a0;
  allocator<char> local_379;
  string local_378 [39];
  allocator<char> local_351;
  string local_350 [39];
  allocator<char> local_329;
  string local_328 [39];
  anon_class_1_0_00000001 local_301;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_300;
  allocator<char> local_2d9;
  string local_2d8 [39];
  allocator<char> local_2b1;
  string local_2b0 [39];
  allocator<char> local_289;
  string local_288 [39];
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  undefined1 local_218 [8];
  ToolOptions options;
  allocator<char> local_99;
  string local_98 [8];
  string WasmCtorEvalOption;
  Split keptExports;
  Split ctors;
  undefined1 local_40 [6];
  bool debugInfo;
  bool emitBinary;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passes;
  Name entry;
  char **argv_local;
  int argc_local;
  
  ::wasm::Name::Name((Name *)&passes.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_40);
  ctors.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  ctors.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  ::wasm::String::Split::Split
            ((Split *)&keptExports.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::wasm::String::Split::Split((Split *)((long)&WasmCtorEvalOption.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,"wasm-ctor-eval options",&local_99);
  std::allocator<char>::~allocator(&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"wasm-ctor-eval",&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"Execute code at compile time",&local_261);
  ::wasm::ToolOptions::ToolOptions((ToolOptions *)local_218,&local_238,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_288,"--output",&local_289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"-o",&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2d8,"Output file (stdout if not specified)",&local_2d9);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__0,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_300,&local_301);
  psVar3 = (string *)
           ::wasm::Options::add
                     ((string *)local_218,local_288,local_2b0,local_2d8,(Arguments)local_98,
                      (function *)0x1,false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_328,"--emit-text",&local_329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_350,"-S",&local_351);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_378,"Emit text instead of binary for the output file",&local_379);
  local_3a8.emitBinary =
       (bool *)((long)&ctors.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__1,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_3a0,&local_3a8);
  psVar3 = (string *)
           ::wasm::Options::add
                     (psVar3,local_328,local_350,local_378,(Arguments)local_98,(function *)0x0,
                      SUB81(&local_3a0,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3c8,"--debuginfo",&local_3c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3f0,"-g",&local_3f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_418,"Emit names section and debug info",&local_419);
  local_448.debugInfo =
       (bool *)((long)&ctors.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 6);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__2,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_440,&local_448);
  psVar3 = (string *)
           ::wasm::Options::add
                     (psVar3,local_3c8,local_3f0,local_418,(Arguments)local_98,(function *)0x0,
                      SUB81(&local_440,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_468,"--ctors",&local_469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_490,"-c",&local_491);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_4b8,"Comma-separated list of global constructor functions to evaluate",&local_4b9
            );
  local_4e8.ctors =
       (Split *)&keptExports.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__3,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_4e0,&local_4e8);
  psVar3 = (string *)
           ::wasm::Options::add
                     (psVar3,local_468,local_490,local_4b8,(Arguments)local_98,(function *)0x1,
                      SUB81(&local_4e0,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_508,"--kept-exports",&local_509);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_530,"-ke",&local_531);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_558,
             "Comma-separated list of ctors whose exports we keep around even if we eval those ctors"
             ,&local_559);
  local_588.keptExports = (Split *)((long)&WasmCtorEvalOption.field_2 + 8);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__4,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_580,&local_588);
  psVar3 = (string *)
           ::wasm::Options::add
                     (psVar3,local_508,local_530,local_558,(Arguments)local_98,(function *)0x1,
                      SUB81(&local_580,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5a8,"--ignore-external-input",&local_5a9)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5d0,"-ipi",&local_5d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_5f8,"Assumes no env vars are to be read, stdin is empty, etc.",&local_5f9);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__5,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_620,&local_621);
  psVar3 = (string *)
           ::wasm::Options::add
                     (psVar3,local_5a8,local_5d0,local_5f8,(Arguments)local_98,(function *)0x0,
                      SUB81(&local_620,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_648,"--quiet",&local_649);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_670,"-q",&local_671);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_698,"Do not emit verbose logging about the eval process",&local_699);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__6,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_6c0,&local_6c1);
  psVar3 = (string *)
           ::wasm::Options::add
                     (psVar3,local_648,local_670,local_698,(Arguments)local_98,(function *)0x0,
                      SUB81(&local_6c0,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6e8,"INFILE",&local_6e9);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__7,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_710,
             (anon_class_1_0_00000001 *)(input.field_2._M_local_buf + 0xf));
  ::wasm::Options::add_positional(psVar3,(Arguments)local_6e8,(function *)0x1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_710);
  std::__cxx11::string::~string(local_6e8);
  std::allocator<char>::~allocator(&local_6e9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_6c0);
  std::__cxx11::string::~string(local_698);
  std::allocator<char>::~allocator(&local_699);
  std::__cxx11::string::~string(local_670);
  std::allocator<char>::~allocator(&local_671);
  std::__cxx11::string::~string(local_648);
  std::allocator<char>::~allocator(&local_649);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_620);
  std::__cxx11::string::~string(local_5f8);
  std::allocator<char>::~allocator(&local_5f9);
  std::__cxx11::string::~string(local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  std::__cxx11::string::~string(local_5a8);
  std::allocator<char>::~allocator(&local_5a9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_580);
  std::__cxx11::string::~string(local_558);
  std::allocator<char>::~allocator(&local_559);
  std::__cxx11::string::~string(local_530);
  std::allocator<char>::~allocator(&local_531);
  std::__cxx11::string::~string(local_508);
  std::allocator<char>::~allocator(&local_509);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_4e0);
  std::__cxx11::string::~string(local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator(&local_491);
  std::__cxx11::string::~string(local_468);
  std::allocator<char>::~allocator(&local_469);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_440);
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator(&local_419);
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  std::__cxx11::string::~string(local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_3a0);
  std::__cxx11::string::~string(local_378);
  std::allocator<char>::~allocator(&local_379);
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator(&local_351);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator(&local_329);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_300);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator(&local_289);
  ::wasm::Options::parse((int)local_218,(char **)(ulong)(uint)argc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_758,"infile",
             (allocator<char> *)((long)&wasm.tagsMap._M_h._M_single_bucket + 7));
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&options,&local_758);
  ::wasm::read_file<std::__cxx11::string>(local_738,(BinaryOption)pmVar4);
  std::__cxx11::string::~string((string *)&local_758);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&wasm.tagsMap._M_h._M_single_bucket + 7));
  ::wasm::Module::Module((Module *)&reader.profile);
  ::wasm::ToolOptions::applyFeatures((ToolOptions *)local_218,(Module *)&reader.profile);
  if (((byte)local_218[0] & 1) != 0) {
    std::operator<<((ostream *)&std::cout,"reading...\n");
  }
  ::wasm::ModuleReader::ModuleReader((ModuleReader *)local_ab4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_af8,"infile",&local_af9);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&options,&local_af8);
  std::__cxx11::string::string(local_ad8,(string *)pmVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b20,"",(allocator<char> *)((long)&p + 7))
  ;
  ::wasm::ModuleReader::read(local_ab4,local_ad8,&reader.profile,local_b20);
  std::__cxx11::string::~string(local_b20);
  std::allocator<char>::~allocator((allocator<char> *)((long)&p + 7));
  std::__cxx11::string::~string(local_ad8);
  std::__cxx11::string::~string((string *)&local_af8);
  std::allocator<char>::~allocator(&local_af9);
  bVar1 = ::wasm::WasmValidator::validate((Module *)local_cb9,(int)&reader + 4);
  if (((bVar1 ^ 0xff) & 1) != 0) {
    poVar6 = (ostream *)std::operator<<((ostream *)&std::cout,(Module *)&reader.profile);
    std::operator<<(poVar6,'\n');
    ::wasm::Fatal::Fatal((Fatal *)(local_e49 + 1));
    ::wasm::Fatal::operator<<((Fatal *)(local_e49 + 1),(char (*) [26])"error in validating input");
    ::wasm::Fatal::~Fatal((Fatal *)(local_e49 + 1));
  }
  bVar2 = anon_unknown.dwarf_51ae1::canEval((Module *)&reader.profile);
  if (bVar2) {
    anon_unknown.dwarf_51ae1::evalCtors
              ((Module *)&reader.profile,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&keptExports.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&WasmCtorEvalOption.field_2 + 8));
    bVar1 = ::wasm::WasmValidator::validate((Module *)local_e49,(int)&reader + 4);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      poVar6 = (ostream *)std::operator<<((ostream *)&std::cout,(Module *)&reader.profile);
      std::operator<<(poVar6,'\n');
      ::wasm::Fatal::Fatal(&local_fd8);
      ::wasm::Fatal::operator<<(&local_fd8,(char (*) [27])"error in validating output");
      ::wasm::Fatal::~Fatal(&local_fd8);
    }
    ::wasm::PassRunner::PassRunner(local_10f0,(Module *)&reader.profile);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1110,"memory-packing",&local_1111);
    ::wasm::PassRunner::add(local_10f0,&local_1110);
    std::__cxx11::string::~string((string *)&local_1110);
    std::allocator<char>::~allocator(&local_1111);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1138,"remove-unused-names",&local_1139);
    ::wasm::PassRunner::add(local_10f0,&local_1138);
    std::__cxx11::string::~string((string *)&local_1138);
    std::allocator<char>::~allocator(&local_1139);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1160,"dce",&local_1161);
    ::wasm::PassRunner::add(local_10f0,&local_1160);
    std::__cxx11::string::~string((string *)&local_1160);
    std::allocator<char>::~allocator(&local_1161);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1188,"merge-blocks",&local_1189);
    ::wasm::PassRunner::add(local_10f0,&local_1188);
    std::__cxx11::string::~string((string *)&local_1188);
    std::allocator<char>::~allocator(&local_1189);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_11b0,"vacuum",&local_11b1);
    ::wasm::PassRunner::add(local_10f0,&local_11b0);
    std::__cxx11::string::~string((string *)&local_11b0);
    std::allocator<char>::~allocator(&local_11b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_11d8,"remove-unused-module-elements",&local_11d9);
    ::wasm::PassRunner::add(local_10f0,&local_11d8);
    std::__cxx11::string::~string((string *)&local_11d8);
    std::allocator<char>::~allocator(&local_11d9);
    ::wasm::PassRunner::run();
    ::wasm::PassRunner::~PassRunner(local_10f0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1200,"output",
             (allocator<char> *)(writer.sourceMapUrl.field_2._M_local_buf + 0xf));
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&options,&local_1200);
  std::__cxx11::string::~string((string *)&local_1200);
  std::allocator<char>::~allocator
            ((allocator<char> *)(writer.sourceMapUrl.field_2._M_local_buf + 0xf));
  if (sVar5 != 0) {
    if (((byte)local_218[0] & 1) != 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"writing...");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    ::wasm::ModuleWriter::ModuleWriter((ModuleWriter *)local_1270);
    ::wasm::ModuleWriter::setBinary
              ((ModuleWriter *)local_1270,
               (bool)(ctors.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
    ::wasm::ModuleIOBase::setDebugInfo
              ((ModuleIOBase *)local_1270,
               (bool)(ctors.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_12b0,"output",&local_12b1);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&options,&local_12b0);
    std::__cxx11::string::string(local_1290,(string *)pmVar4);
    ::wasm::ModuleWriter::write(local_1270,&reader.profile,local_1290);
    std::__cxx11::string::~string(local_1290);
    std::__cxx11::string::~string((string *)&local_12b0);
    std::allocator<char>::~allocator(&local_12b1);
    ::wasm::ModuleWriter::~ModuleWriter((ModuleWriter *)local_1270);
  }
  ::wasm::Module::~Module((Module *)&reader.profile);
  std::__cxx11::string::~string(local_738);
  ::wasm::ToolOptions::~ToolOptions((ToolOptions *)local_218);
  std::__cxx11::string::~string(local_98);
  ::wasm::String::Split::~Split((Split *)((long)&WasmCtorEvalOption.field_2 + 8));
  ::wasm::String::Split::~Split
            ((Split *)&keptExports.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  return 0;
}

Assistant:

int main(int argc, const char* argv[]) {
  Name entry;
  std::vector<std::string> passes;
  bool emitBinary = true;
  bool debugInfo = false;
  String::Split ctors;
  String::Split keptExports;

  const std::string WasmCtorEvalOption = "wasm-ctor-eval options";

  ToolOptions options("wasm-ctor-eval", "Execute code at compile time");
  options
    .add("--output",
         "-o",
         "Output file (stdout if not specified)",
         WasmCtorEvalOption,
         Options::Arguments::One,
         [](Options* o, const std::string& argument) {
           o->extra["output"] = argument;
           Colors::setEnabled(false);
         })
    .add("--emit-text",
         "-S",
         "Emit text instead of binary for the output file",
         WasmCtorEvalOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { emitBinary = false; })
    .add("--debuginfo",
         "-g",
         "Emit names section and debug info",
         WasmCtorEvalOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arguments) { debugInfo = true; })
    .add("--ctors",
         "-c",
         "Comma-separated list of global constructor functions to evaluate",
         WasmCtorEvalOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           ctors = String::Split(argument, ",");
         })
    .add(
      "--kept-exports",
      "-ke",
      "Comma-separated list of ctors whose exports we keep around even if we "
      "eval those ctors",
      WasmCtorEvalOption,
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) {
        keptExports = String::Split(argument, ",");
      })
    .add("--ignore-external-input",
         "-ipi",
         "Assumes no env vars are to be read, stdin is empty, etc.",
         WasmCtorEvalOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           ignoreExternalInput = true;
         })
    .add("--quiet",
         "-q",
         "Do not emit verbose logging about the eval process",
         WasmCtorEvalOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { quiet = true; })
    .add_positional("INFILE",
                    Options::Arguments::One,
                    [](Options* o, const std::string& argument) {
                      o->extra["infile"] = argument;
                    });
  options.parse(argc, argv);

  auto input(read_file<std::string>(options.extra["infile"], Flags::Text));

  Module wasm;
  options.applyFeatures(wasm);

  {
    if (options.debug) {
      std::cout << "reading...\n";
    }
    ModuleReader reader;
    try {
      reader.read(options.extra["infile"], wasm);
    } catch (ParseException& p) {
      p.dump(std::cout);
      Fatal() << "error in parsing input";
    }
  }

  if (!WasmValidator().validate(wasm)) {
    std::cout << wasm << '\n';
    Fatal() << "error in validating input";
  }

  if (canEval(wasm)) {
    evalCtors(wasm, ctors, keptExports);

    if (!WasmValidator().validate(wasm)) {
      std::cout << wasm << '\n';
      Fatal() << "error in validating output";
    }

    // Do some useful optimizations after the evalling
    {
      PassRunner passRunner(&wasm);
      passRunner.add("memory-packing"); // we flattened it, so re-optimize
      // TODO: just do -Os for the one function
      passRunner.add("remove-unused-names");
      passRunner.add("dce");
      passRunner.add("merge-blocks");
      passRunner.add("vacuum");
      passRunner.add("remove-unused-module-elements");
      passRunner.run();
    }
  }

  if (options.extra.count("output") > 0) {
    if (options.debug) {
      std::cout << "writing..." << std::endl;
    }
    ModuleWriter writer;
    writer.setBinary(emitBinary);
    writer.setDebugInfo(debugInfo);
    writer.write(wasm, options.extra["output"]);
  }
}